

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

void * alsaCallbackHandler(void *ptr)

{
  RtApiAlsa *this;
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  bool *isRunning;
  RtApiAlsa *object;
  CallbackInfo *info;
  void *ptr_local;
  
  this = *ptr;
  if ((*(byte *)((long)ptr + 0x29) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"RtAudio alsa: ");
    iVar1 = sched_getscheduler(0);
    pcVar3 = "_NOT_ ";
    if (iVar1 == 2) {
      pcVar3 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"running realtime scheduling");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  while ((*(byte *)((long)ptr + 0x28) & 1) == 1) {
    pthread_testcancel();
    RtApiAlsa::callbackEvent(this);
  }
  pthread_exit((void *)0x0);
}

Assistant:

static void *alsaCallbackHandler( void *ptr )
{
  CallbackInfo *info = (CallbackInfo *) ptr;
  RtApiAlsa *object = (RtApiAlsa *) info->object;
  bool *isRunning = &info->isRunning;

#ifdef SCHED_RR // Undefined with some OSes (e.g. NetBSD 1.6.x with GNU Pthread)
  if ( info->doRealtime ) {
    std::cerr << "RtAudio alsa: " << 
             (sched_getscheduler(0) == SCHED_RR ? "" : "_NOT_ ") << 
             "running realtime scheduling" << std::endl;
  }
#endif

  while ( *isRunning == true ) {
    pthread_testcancel();
    object->callbackEvent();
  }

  pthread_exit( NULL );
}